

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall kj::Vector<kj::CidrRange>::setCapacity(Vector<kj::CidrRange> *this,size_t newSize)

{
  CidrRange *pCVar1;
  CidrRange *__dest;
  size_t __n;
  ArrayBuilder<kj::CidrRange> local_38;
  
  pCVar1 = (this->builder).ptr;
  if (newSize < (ulong)(((long)(this->builder).pos - (long)pCVar1) / 0x18)) {
    (this->builder).pos = pCVar1 + newSize;
  }
  __dest = kj::_::HeapArrayDisposer::allocateUninitialized<kj::CidrRange>(newSize);
  local_38.endPtr = __dest + newSize;
  local_38.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pCVar1 = (this->builder).ptr;
  __n = (long)(this->builder).pos - (long)pCVar1;
  local_38.ptr = __dest;
  if (__n != 0) {
    memcpy(__dest,pCVar1,__n);
  }
  local_38.pos = (RemoveConst<kj::CidrRange> *)((long)__dest + __n);
  ArrayBuilder<kj::CidrRange>::operator=(&this->builder,&local_38);
  ArrayBuilder<kj::CidrRange>::dispose(&local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }